

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.pb.cc
# Opt level: O1

char * __thiscall
google::protobuf::compiler::CodeGeneratorResponse::_InternalParse
          (CodeGeneratorResponse *this,char *ptr,ParseContext *ctx)

{
  byte bVar1;
  int iVar2;
  internal *this_00;
  char *size;
  Rep *pRVar3;
  bool bVar4;
  string *s;
  CodeGeneratorResponse_File *obj;
  MessageLite *msg;
  char *pcVar5;
  uint uVar6;
  ulong uVar7;
  undefined8 *puVar8;
  UnknownFieldSet *unknown;
  byte *p;
  uint uVar9;
  char cVar10;
  uint uVar11;
  StringPiece str;
  pair<const_char_*,_unsigned_int> pVar12;
  pair<const_char_*,_unsigned_long> pVar13;
  byte *local_50;
  InternalMetadata *local_48;
  long local_40;
  ArenaStringPtr *local_38;
  
  local_50 = (byte *)ptr;
  bVar4 = internal::EpsCopyInputStream::DoneWithCheck
                    (&ctx->super_EpsCopyInputStream,(char **)&local_50,ctx->group_depth_);
  uVar9 = 0;
  if (!bVar4) {
    local_38 = &this->error_;
    local_48 = &(this->super_Message).super_MessageLite._internal_metadata_;
    uVar9 = 0;
    local_40 = 9;
    do {
      bVar1 = *local_50;
      uVar11 = (uint)bVar1;
      p = local_50 + 1;
      if ((char)bVar1 < '\0') {
        uVar11 = ((uint)bVar1 + (uint)*p * 0x80) - 0x80;
        if ((char)*p < '\0') {
          pVar12 = internal::ReadTagFallback((char *)local_50,uVar11);
          p = (byte *)pVar12.first;
          uVar11 = pVar12.second;
        }
        else {
          p = local_50 + 2;
        }
      }
      uVar6 = uVar11 >> 3;
      pcVar5 = (char *)(ulong)uVar6;
      cVar10 = (char)uVar11;
      local_50 = p;
      if (uVar6 == 0xf) {
        if (cVar10 == 'z') {
          local_50 = p + -1;
          goto LAB_00287555;
        }
LAB_002875ba:
        if (uVar11 == 0 || (uVar11 & 7) == 4) {
          if (p != (byte *)0x0) {
            (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = uVar11 - 1;
            pcVar5 = (char *)(*(code *)(&DAT_003f55dc + *(int *)(&DAT_003f55dc + local_40 * 4)))();
            return pcVar5;
          }
          goto LAB_0028769d;
        }
        if ((local_48->ptr_ & 1U) == 0) {
          unknown = internal::InternalMetadata::
                    mutable_unknown_fields_slow<google::protobuf::UnknownFieldSet>(local_48);
        }
        else {
          unknown = (UnknownFieldSet *)((local_48->ptr_ & 0xfffffffffffffffcU) + 8);
        }
        local_50 = (byte *)internal::UnknownFieldParse((ulong)uVar11,unknown,(char *)local_50,ctx);
        uVar7 = (ulong)((uint)(local_50 == (byte *)0x0) * 5);
        goto LAB_00287629;
      }
      if (uVar6 == 2) {
        if (cVar10 != '\x10') goto LAB_002875ba;
        uVar9 = 2;
        bVar1 = *p;
        pVar13.second = (long)(char)bVar1;
        pVar13.first = (char *)p;
        local_50 = p + 1;
        if ((long)(char)bVar1 < 0) {
          uVar11 = ((uint)*local_50 * 0x80 + (uint)bVar1) - 0x80;
          if (-1 < (char)*local_50) {
            local_50 = p + 2;
            this->supported_features_ = (ulong)uVar11;
            switch(local_50 == (byte *)0x0) {
            case true:
              goto switchD_00287503_caseD_1;
            }
            goto switchD_00287503_caseD_0;
          }
          local_50 = p;
          pVar13 = internal::VarintParseSlow64((char *)p,uVar11);
          local_50 = (byte *)pVar13.first;
        }
        this->supported_features_ = pVar13.second;
        switch(local_50 == (byte *)0x0) {
        case true:
          goto switchD_00287503_caseD_1;
        }
      }
      else {
        if ((uVar6 != 1) || (cVar10 != '\n')) goto LAB_002875ba;
        *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 1;
        uVar7 = (this->super_Message).super_MessageLite._internal_metadata_.ptr_;
        puVar8 = (undefined8 *)(uVar7 & 0xfffffffffffffffc);
        if ((uVar7 & 1) != 0) {
          puVar8 = (undefined8 *)*puVar8;
        }
        s = internal::ArenaStringPtr::Mutable_abi_cxx11_(local_38,puVar8);
        local_50 = (byte *)internal::InlineGreedyStringParser(s,(char *)local_50,ctx);
        this_00 = (internal *)(s->_M_dataplus)._M_p;
        size = (char *)s->_M_string_length;
        if ((long)size < 0) {
          stringpiece_internal::StringPiece::LogFatalSizeTooBig
                    ((size_t)size,"string length exceeds max size");
        }
        str.length_ = (size_type)"google.protobuf.compiler.CodeGeneratorResponse.error";
        str.ptr_ = size;
        internal::VerifyUTF8(this_00,str,pcVar5);
        switch(local_50 == (byte *)0x0) {
        case true:
switchD_00287503_caseD_1:
          local_50 = (byte *)0x0;
          goto LAB_002876db;
        }
      }
switchD_00287503_caseD_0:
      bVar4 = internal::EpsCopyInputStream::DoneWithCheck
                        (&ctx->super_EpsCopyInputStream,(char **)&local_50,ctx->group_depth_);
    } while (!bVar4);
  }
LAB_002876db:
  (this->_has_bits_).has_bits_[0] = (this->_has_bits_).has_bits_[0] | uVar9;
  return (char *)local_50;
LAB_0028769d:
  uVar7 = 5;
  goto LAB_00287629;
  while ((uVar7 = 2, local_50 < (ctx->super_EpsCopyInputStream).limit_end_ && (*local_50 == 0x7a)))
  {
LAB_00287555:
    local_50 = local_50 + 1;
    pRVar3 = (this->file_).super_RepeatedPtrFieldBase.rep_;
    if (pRVar3 == (Rep *)0x0) {
LAB_00287578:
      obj = Arena::CreateMaybeMessage<google::protobuf::compiler::CodeGeneratorResponse_File>
                      ((this->file_).super_RepeatedPtrFieldBase.arena_);
      msg = (MessageLite *)
            internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                      (&(this->file_).super_RepeatedPtrFieldBase,obj);
    }
    else {
      iVar2 = (this->file_).super_RepeatedPtrFieldBase.current_size_;
      if (pRVar3->allocated_size <= iVar2) goto LAB_00287578;
      (this->file_).super_RepeatedPtrFieldBase.current_size_ = iVar2 + 1;
      msg = (MessageLite *)pRVar3->elements[iVar2];
    }
    local_50 = (byte *)internal::ParseContext::ParseMessage(ctx,msg,(char *)local_50);
    if (local_50 == (byte *)0x0) goto LAB_0028769d;
  }
LAB_00287629:
  pcVar5 = (char *)(*(code *)(&DAT_003f55dc + *(int *)(&DAT_003f55dc + uVar7 * 4)))();
  return pcVar5;
}

Assistant:

const char* CodeGeneratorResponse::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  _Internal::HasBits has_bits{};
  while (!ctx->Done(&ptr)) {
    uint32_t tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    switch (tag >> 3) {
      // optional string error = 1;
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 10)) {
          auto str = _internal_mutable_error();
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParser(str, ptr, ctx);
          #ifndef NDEBUG
          ::PROTOBUF_NAMESPACE_ID::internal::VerifyUTF8(str, "google.protobuf.compiler.CodeGeneratorResponse.error");
          #endif  // !NDEBUG
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // optional uint64 supported_features = 2;
      case 2:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 16)) {
          _Internal::set_has_supported_features(&has_bits);
          supported_features_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint64(&ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // repeated .google.protobuf.compiler.CodeGeneratorResponse.File file = 15;
      case 15:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 122)) {
          ptr -= 1;
          do {
            ptr += 1;
            ptr = ctx->ParseMessage(_internal_add_file(), ptr);
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<122>(ptr));
        } else
          goto handle_unusual;
        continue;
      default:
        goto handle_unusual;
    }  // switch
  handle_unusual:
    if ((tag == 0) || ((tag & 7) == 4)) {
      CHK_(ptr);
      ctx->SetLastTag(tag);
      goto message_done;
    }
    ptr = UnknownFieldParse(
        tag,
        _internal_metadata_.mutable_unknown_fields<::PROTOBUF_NAMESPACE_ID::UnknownFieldSet>(),
        ptr, ctx);
    CHK_(ptr != nullptr);
  }  // while
message_done:
  _has_bits_.Or(has_bits);
  return ptr;
failure:
  ptr = nullptr;
  goto message_done;
#undef CHK_
}